

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-core.c
# Opt level: O0

gchar ** media_player2_proxy_get_supported_uri_schemes(MediaPlayer2 *object)

{
  undefined4 uVar1;
  GType GVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  MediaPlayer2 *local_30;
  gchar **value;
  GVariant *variant;
  MediaPlayer2Proxy *proxy;
  MediaPlayer2 *object_local;
  
  GVar2 = media_player2_proxy_get_type();
  lVar3 = g_type_check_instance_cast(object,GVar2);
  local_30 = (MediaPlayer2 *)
             g_datalist_get_data(*(undefined8 *)(lVar3 + 0x20),"SupportedUriSchemes");
  object_local = local_30;
  if (local_30 == (MediaPlayer2 *)0x0) {
    uVar4 = g_dbus_proxy_get_type();
    uVar4 = g_type_check_instance_cast(lVar3,uVar4);
    lVar5 = g_dbus_proxy_get_cached_property(uVar4,"SupportedUriSchemes");
    if (lVar5 != 0) {
      local_30 = (MediaPlayer2 *)g_variant_get_strv(lVar5,0);
      uVar4 = *(undefined8 *)(lVar3 + 0x20);
      uVar1 = g_quark_from_string("SupportedUriSchemes");
      g_datalist_id_set_data_full(uVar4,uVar1,local_30,g_free);
      g_variant_unref(lVar5);
    }
    object_local = local_30;
  }
  return (gchar **)object_local;
}

Assistant:

static const gchar *const *
media_player2_proxy_get_supported_uri_schemes (MediaPlayer2 *object)
{
  MediaPlayer2Proxy *proxy = MEDIA_PLAYER2_PROXY (object);
  GVariant *variant;
  const gchar *const *value = NULL;
  value = g_datalist_get_data (&proxy->priv->qdata, "SupportedUriSchemes");
  if (value != NULL)
    return value;
  variant = g_dbus_proxy_get_cached_property (G_DBUS_PROXY (proxy), "SupportedUriSchemes");
  if (variant != NULL)
    {
      value = g_variant_get_strv (variant, NULL);
      g_datalist_set_data_full (&proxy->priv->qdata, "SupportedUriSchemes", (gpointer) value, g_free);
      g_variant_unref (variant);
    }
  return value;
}